

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BankAccount.cpp
# Opt level: O2

void __thiscall L13_2::BankAccountPlus::view(BankAccountPlus *this)

{
  set_format();
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 2;
  BankAccount::view(&this->super_BankAccount);
  std::operator<<((ostream *)&std::cout,"[BankAccountPlus] Maximum loan: $");
}

Assistant:

void BankAccountPlus::view() const {
        format initState = set_format();
        precis initPrec = cout.precision(2);

        //  Todo:
        BankAccount::view();
        cout << "[BankAccountPlus] Maximum loan: $" << _max_loan << endl;
        cout << "[BankAccountPlus] Current loan: $" << _loan << endl;
        cout.precision(3); // ###.###
        cout << "[BankAccountPlus] Rate: " << 100 * _rate << "%\n";

        reset_format(initState, initPrec);
    }